

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

void __thiscall re2::Tester::~Tester(Tester *this)

{
  pointer ppTVar1;
  TestInstance *this_00;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppTVar1 = (this->v_).
                super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->v_).
                            super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppTVar1[uVar2];
    if (this_00 != (TestInstance *)0x0) {
      TestInstance::~TestInstance(this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::~_Vector_base
            (&(this->v_).
              super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>);
  return;
}

Assistant:

Tester::~Tester() {
  for (size_t i = 0; i < v_.size(); i++)
    delete v_[i];
}